

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O1

void __thiscall FSerializer::WriteObjects(FSerializer *this)

{
  DObject *this_00;
  int iVar1;
  FWriter *pFVar2;
  undefined4 extraout_var;
  ulong uVar3;
  
  if ((this->w != (FWriter *)0x0) && ((this->w->mDObjects).Count != 0)) {
    BeginArray(this,"objects");
    pFVar2 = this->w;
    if ((pFVar2->mDObjects).Count != 0) {
      uVar3 = 0;
      do {
        this_00 = (pFVar2->mDObjects).Array[uVar3];
        BeginObject(this,(char *)0x0);
        FWriter::Key(this->w,"classtype");
        pFVar2 = this->w;
        if (this_00->Class == (PClass *)0x0) {
          iVar1 = (**this_00->_vptr_DObject)(this_00);
          this_00->Class = (PClass *)CONCAT44(extraout_var,iVar1);
        }
        FWriter::String(pFVar2,FName::NameData.NameArray
                               [(this_00->Class->super_PNativeStruct).super_PStruct.super_PNamedType
                                .TypeName.Index].Text);
        DObject::SerializeUserVars(this_00,this);
        (*this_00->_vptr_DObject[3])(this_00);
        DObject::CheckIfSerialized(this_00);
        EndObject(this);
        uVar3 = uVar3 + 1;
        pFVar2 = this->w;
      } while (uVar3 < (pFVar2->mDObjects).Count);
    }
    EndArray(this);
    return;
  }
  return;
}

Assistant:

bool isWriting() const
	{
		return w != nullptr;
	}